

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix * __thiscall maths::Matrix::operator=(Matrix *this,Matrix *m)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  
  if (this != m) {
    if ((this->rows_ != m->rows_) || (this->cols_ != m->cols_)) {
      if (0 < this->rows_) {
        lVar8 = 0;
        do {
          if (this->p[lVar8] != (double *)0x0) {
            operator_delete__(this->p[lVar8]);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->rows_);
      }
      if (this->p != (double **)0x0) {
        operator_delete__(this->p);
      }
      iVar1 = m->cols_;
      this->rows_ = m->rows_;
      this->cols_ = iVar1;
      allocSpace(this);
    }
    iVar1 = this->rows_;
    if (0 < (long)iVar1) {
      uVar2 = this->cols_;
      ppdVar3 = m->p;
      ppdVar4 = this->p;
      lVar8 = 0;
      do {
        if (0 < (int)uVar2) {
          pdVar5 = ppdVar3[lVar8];
          pdVar6 = ppdVar4[lVar8];
          uVar7 = 0;
          do {
            pdVar6[uVar7] = pdVar5[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar1);
    }
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& m)
{

    if (this == &m) {
        return *this;
    }

    if (rows_ != m.rows_ || cols_ != m.cols_) {
        for (int i = 0; i < rows_; ++i) {
            delete[] p[i];
        }
        delete[] p;

        rows_ = m.rows_;
        cols_ = m.cols_;
        allocSpace();
    }

    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = m.p[i][j];
        }
    }
    return *this;
}